

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

shared_ptr<chrono::ChBody> __thiscall
chrono::utils::CreateBoxContainer
          (utils *this,ChSystem *system,int id,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChVector<double> *hdim,double hthick,ChVector<double> *pos,ChQuaternion<double> *rot,
          bool collide,bool y_up,bool overlap,bool closed)

{
  long lVar1;
  ChBody *pCVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  shared_ptr<chrono::ChVisualMaterial> *psVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined1 auVar14 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  shared_ptr<chrono::ChBody> sVar21;
  ChVector<double> local_268;
  ChVector<double> local_248;
  ChQuaternion<double> local_230;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *local_210;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  undefined8 uStack_1f0;
  double local_1e8;
  double dStack_1e0;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_198;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_178;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_128;
  undefined1 local_118 [16];
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_100;
  shared_ptr<chrono::ChVisualMaterial> local_f0;
  shared_ptr<chrono::ChVisualMaterial> local_e0;
  shared_ptr<chrono::ChVisualMaterial> local_d0;
  shared_ptr<chrono::ChVisualMaterial> local_c0;
  shared_ptr<chrono::ChVisualMaterial> local_b0;
  shared_ptr<chrono::ChVisualMaterial> local_a0;
  shared_ptr<chrono::ChVisualMaterial> local_90;
  shared_ptr<chrono::ChVisualMaterial> local_80;
  shared_ptr<chrono::ChVisualMaterial> local_70;
  shared_ptr<chrono::ChVisualMaterial> local_60;
  shared_ptr<chrono::ChVisualMaterial> local_50;
  shared_ptr<chrono::ChVisualMaterial> local_40;
  
  local_1f8 = (double)CONCAT44(local_1f8._4_4_,(uint)overlap);
  local_210 = &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>;
  local_208 = hthick;
  uStack_200 = in_XMM0_Qb;
  iVar12 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->_vptr_ChMaterialSurface[3])();
  iVar13 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                     (system);
  if (iVar12 != iVar13) {
    __assert_fail("mat->GetContactMethod() == system->GetContactMethod()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsCreators.cpp"
                  ,0x26f,
                  "std::shared_ptr<ChBody> chrono::utils::CreateBoxContainer(ChSystem *, int, std::shared_ptr<ChMaterialSurface>, const ChVector<> &, double, const ChVector<> &, const ChQuaternion<> &, bool, bool, bool, bool)"
                 );
  }
  iVar12 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x30])
                     (system);
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<chrono::ChBody,void>
            ((__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> *)this,
             (ChBody *)CONCAT44(extraout_var,iVar12));
  lVar1 = *(long *)this;
  *(int *)(lVar1 + 0x28) = id;
  ChVariablesBodyOwnMass::SetBodyMass((ChVariablesBodyOwnMass *)(lVar1 + 0x260),1.0);
  lVar1 = *(long *)this;
  if ((ChVector<double> *)(lVar1 + 0x80) != pos) {
    *(double *)(lVar1 + 0x80) = pos->m_data[0];
    *(double *)(lVar1 + 0x88) = pos->m_data[1];
    *(double *)(lVar1 + 0x90) = pos->m_data[2];
  }
  ChFrame<double>::SetRot((ChFrame<double> *)(lVar1 + 0x78),rot);
  ChBody::SetCollide(*(ChBody **)this,collide);
  ChBody::SetBodyFixed(*(ChBody **)this,true);
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_230,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)this + 0x198));
  (*(*(_func_int ***)local_230.m_data[0])[3])();
  local_1f8 = (double)((ulong)(SUB81(local_1f8,0) & 1) * (long)(local_208 + local_208));
  uStack_1f0 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_230.m_data + 1));
  auVar7._8_8_ = uStack_200;
  auVar7._0_8_ = local_208;
  pCVar2 = *(ChBody **)this;
  auVar14._8_8_ = 0x8000000000000000;
  auVar14._0_8_ = 0x8000000000000000;
  local_118 = vxorpd_avx512vl(auVar7,auVar14);
  if (y_up) {
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_128,local_210);
    local_248.m_data[0] = local_1f8 + hdim->m_data[0];
    local_248.m_data[2] = local_1f8 + hdim->m_data[1];
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_268.m_data[0] = 0.0;
    local_230.m_data[3] = 0.0;
    local_248.m_data[1] = local_208;
    local_268.m_data[1] = (double)local_118._0_8_;
    local_268.m_data[2] = 0.0;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_128,&local_248,&local_268,
                   &local_230,true,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
    pCVar2 = *(ChBody **)this;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_138,local_210);
    local_268.m_data[1] = hdim->m_data[2];
    local_248.m_data[1] = local_1f8 + local_268.m_data[1];
    local_248.m_data[2] = local_1f8 + hdim->m_data[1];
    local_248.m_data[0] = local_208;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = hdim->m_data[0];
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_230.m_data[3] = 0.0;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar14 = vxorpd_avx512vl(auVar20,auVar3);
    local_268.m_data[0] = auVar14._0_8_ - local_208;
    local_268.m_data[2] = 0.0;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_138,&local_248,&local_268,
                   &local_230,true,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
    pCVar2 = *(ChBody **)this;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_148,local_210);
    local_268.m_data[1] = hdim->m_data[2];
    local_248.m_data[1] = local_1f8 + local_268.m_data[1];
    local_248.m_data[2] = local_1f8 + hdim->m_data[1];
    local_248.m_data[0] = local_208;
    local_268.m_data[0] = local_208 + hdim->m_data[0];
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_230.m_data[3] = 0.0;
    local_268.m_data[2] = 0.0;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_148,&local_248,&local_268,
                   &local_230,true,&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
    pCVar2 = *(ChBody **)this;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_158,local_210);
    local_268.m_data[1] = hdim->m_data[2];
    local_248.m_data[0] = local_1f8 + hdim->m_data[0];
    local_248.m_data[1] = local_1f8 + local_268.m_data[1];
    local_248.m_data[2] = local_208;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = hdim->m_data[1];
    local_268.m_data[0] = 0.0;
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_230.m_data[3] = 0.0;
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar14 = vxorpd_avx512vl(auVar15,auVar4);
    local_268.m_data[2] = auVar14._0_8_ - local_208;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_158,&local_248,&local_268,
                   &local_230,true,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_70.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
    pCVar2 = *(ChBody **)this;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_168,local_210);
    local_268.m_data[1] = hdim->m_data[2];
    local_248.m_data[0] = local_1f8 + hdim->m_data[0];
    local_248.m_data[1] = local_1f8 + local_268.m_data[1];
    local_248.m_data[2] = local_208;
    local_268.m_data[2] = local_208 + hdim->m_data[1];
    local_268.m_data[0] = 0.0;
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_230.m_data[3] = 0.0;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_168,&local_248,&local_268,
                   &local_230,true,&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_80.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
    if (!closed) goto LAB_00e35ab6;
    pCVar2 = *(ChBody **)this;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_178,local_210);
    auVar8._8_8_ = uStack_200;
    auVar8._0_8_ = local_208;
    local_248.m_data[0] = local_1f8 + hdim->m_data[0];
    local_248.m_data[2] = local_1f8 + hdim->m_data[1];
    local_248.m_data[1] = local_208;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = hdim->m_data[2];
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_268.m_data[0] = 0.0;
    local_230.m_data[3] = 0.0;
    auVar14 = vfmadd132sd_fma(auVar16,auVar8,ZEXT816(0x4000000000000000));
    local_268.m_data[1] = auVar14._0_8_;
    local_268.m_data[2] = 0.0;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_178,&local_248,&local_268,
                   &local_230,true,&local_90);
    p_Var10 = &local_178;
    psVar11 = &local_90;
  }
  else {
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_188,local_210);
    local_1e8 = local_1f8;
    dStack_1e0 = local_1f8;
    local_248.m_data[0] = local_1f8 + hdim->m_data[0];
    local_248.m_data[1] = local_1f8 + hdim->m_data[1];
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_230.m_data[3] = 0.0;
    local_248.m_data[2] = local_208;
    local_268.m_data[0] = 0.0;
    local_268.m_data[1] = 0.0;
    local_268.m_data[2] = (double)local_118._0_8_;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_188,&local_248,&local_268,
                   &local_230,true,&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188._M_refcount);
    pCVar2 = *(ChBody **)this;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_198,local_210);
    local_248.m_data[0] = local_208;
    local_248.m_data[1] = local_1e8 + hdim->m_data[1];
    local_248.m_data[2] = dStack_1e0 + hdim->m_data[2];
    local_268.m_data[2] = hdim->m_data[2];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = hdim->m_data[0];
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_230.m_data[3] = 0.0;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar14 = vxorpd_avx512vl(auVar17,auVar5);
    local_268.m_data[0] = auVar14._0_8_ - local_208;
    local_268.m_data[1] = 0.0;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_198,&local_248,&local_268,
                   &local_230,true,&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198._M_refcount);
    pCVar2 = *(ChBody **)this;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1a8,local_210);
    local_248.m_data[0] = local_208;
    local_248.m_data[1] = local_1e8 + hdim->m_data[1];
    local_248.m_data[2] = dStack_1e0 + hdim->m_data[2];
    local_268.m_data[2] = hdim->m_data[2];
    local_268.m_data[0] = local_208 + hdim->m_data[0];
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_230.m_data[3] = 0.0;
    local_268.m_data[1] = 0.0;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_1a8,&local_248,&local_268,
                   &local_230,true,&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_c0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
    pCVar2 = *(ChBody **)this;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1b8,local_210);
    local_268.m_data[2] = hdim->m_data[2];
    local_248.m_data[0] = local_1f8 + hdim->m_data[0];
    local_248.m_data[2] = local_1f8 + local_268.m_data[2];
    local_248.m_data[1] = local_208;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = hdim->m_data[1];
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_268.m_data[0] = 0.0;
    local_230.m_data[3] = 0.0;
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar14 = vxorpd_avx512vl(auVar18,auVar6);
    local_268.m_data[1] = auVar14._0_8_ - local_208;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_1b8,&local_248,&local_268,
                   &local_230,true,&local_d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_d0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
    pCVar2 = *(ChBody **)this;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1c8,local_210);
    local_268.m_data[2] = hdim->m_data[2];
    local_248.m_data[0] = local_1f8 + hdim->m_data[0];
    local_248.m_data[2] = local_1f8 + local_268.m_data[2];
    local_248.m_data[1] = local_208;
    local_268.m_data[1] = local_208 + hdim->m_data[1];
    local_268.m_data[0] = 0.0;
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_230.m_data[3] = 0.0;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_1c8,&local_248,&local_268,
                   &local_230,true,&local_e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_e0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
    if (!closed) goto LAB_00e35ab6;
    pCVar2 = *(ChBody **)this;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1d8,local_210);
    auVar9._8_8_ = uStack_200;
    auVar9._0_8_ = local_208;
    local_248.m_data[0] = local_1e8 + hdim->m_data[0];
    local_248.m_data[1] = dStack_1e0 + hdim->m_data[1];
    local_248.m_data[2] = local_208;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = hdim->m_data[2];
    local_230.m_data[0] = (double)&DAT_3ff0000000000000;
    local_230.m_data[3] = 0.0;
    auVar14 = vfmadd132sd_fma(auVar19,auVar9,ZEXT816(0x4000000000000000));
    local_268.m_data[0] = 0.0;
    local_268.m_data[1] = 0.0;
    local_230.m_data[1] = 0.0;
    local_230.m_data[2] = 0.0;
    local_268.m_data[2] = auVar14._0_8_;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar2,(shared_ptr<chrono::ChMaterialSurface> *)&local_1d8,&local_248,&local_268,
                   &local_230,true,&local_f0);
    p_Var10 = &local_1d8;
    psVar11 = &local_f0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(psVar11->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var10->_M_refcount);
LAB_00e35ab6:
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_230,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)this + 0x198));
  (*(*(_func_int ***)local_230.m_data[0])[4])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_230.m_data + 1));
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_100,(__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)this);
  (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
            (system,&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  sVar21.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar21.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChBody>)
         sVar21.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChBody> CreateBoxContainer(ChSystem* system,
                                           int id,
                                           std::shared_ptr<ChMaterialSurface> mat,
                                           const ChVector<>& hdim,
                                           double hthick,
                                           const ChVector<>& pos,
                                           const ChQuaternion<>& rot,
                                           bool collide,
                                           bool y_up,
                                           bool overlap,
                                           bool closed) {
    // Verify consistency of input arguments.
    assert(mat->GetContactMethod() == system->GetContactMethod());

    // Create the body and set material
    std::shared_ptr<ChBody> body(system->NewBody());

    // Set body properties and geometry.
    body->SetIdentifier(id);
    body->SetMass(1);
    body->SetPos(pos);
    body->SetRot(rot);
    body->SetCollide(collide);
    body->SetBodyFixed(true);
    double o_lap = 0;
    if (overlap) {
        o_lap = hthick * 2;
    }
    body->GetCollisionModel()->ClearModel();
    if (y_up) {
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hthick, hdim.y() + o_lap),
                       ChVector<>(0, -hthick, 0));
        AddBoxGeometry(body.get(), mat, ChVector<>(hthick, hdim.z() + o_lap, hdim.y() + o_lap),
                       ChVector<>(-hdim.x() - hthick, hdim.z(), 0));
        AddBoxGeometry(body.get(), mat, ChVector<>(hthick, hdim.z() + o_lap, hdim.y() + o_lap),
                       ChVector<>(hdim.x() + hthick, hdim.z(), 0));
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hdim.z() + o_lap, hthick),
                       ChVector<>(0, hdim.z(), -hdim.y() - hthick));
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hdim.z() + o_lap, hthick),
                       ChVector<>(0, hdim.z(), hdim.y() + hthick));
        if (closed) {
            AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hthick, hdim.y() + o_lap),
                           ChVector<>(0, hdim.z() * 2 + hthick, 0));
        }
    } else {
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hdim.y() + o_lap, hthick),
                       ChVector<>(0, 0, -hthick));
        AddBoxGeometry(body.get(), mat, ChVector<>(hthick, hdim.y() + o_lap, hdim.z() + o_lap),
                       ChVector<>(-hdim.x() - hthick, 0, hdim.z()));
        AddBoxGeometry(body.get(), mat, ChVector<>(hthick, hdim.y() + o_lap, hdim.z() + o_lap),
                       ChVector<>(hdim.x() + hthick, 0, hdim.z()));
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hthick, hdim.z() + o_lap),
                       ChVector<>(0, -hdim.y() - hthick, hdim.z()));
        AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hthick, hdim.z() + o_lap),
                       ChVector<>(0, hdim.y() + hthick, hdim.z()));
        if (closed) {
            AddBoxGeometry(body.get(), mat, ChVector<>(hdim.x() + o_lap, hdim.y() + o_lap, hthick),
                           ChVector<>(0, 0, hdim.z() * 2 + hthick));
        }
    }
    body->GetCollisionModel()->BuildModel();

    // Attach the body to the system.
    system->AddBody(body);
    return body;
}